

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O2

uint64_t evaluate_solution(color_quad_u8 *pLow,color_quad_u8 *pHigh,uint32_t *pbits,
                          color_cell_compressor_params *pParams,
                          color_cell_compressor_results *pResults)

{
  bc7enc_bool bVar1;
  byte bVar2;
  uint8_t auVar3 [4];
  uint8_t auVar4 [4];
  uint32_t uVar5;
  color_quad_u8 cVar6;
  int iVar7;
  uint uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  void *pvVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint8_t uVar19;
  undefined4 uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  uint32_t j;
  long lVar27;
  uint uVar28;
  uint32_t j_1;
  ulong uVar29;
  color_quad_u8 *pcVar30;
  bool bVar31;
  color_quad_u8 quantMaxColor;
  color_quad_u8 quantMinColor;
  uint local_e0;
  color_quad_u8 actualMaxColor;
  color_quad_u8 actualMinColor;
  color_quad_u8 weightedColors [16];
  
  auVar3 = *&pLow->m_c;
  auVar4 = *&pHigh->m_c;
  quantMaxColor.m_c = auVar4;
  quantMinColor.m_c = auVar3;
  if (pParams->m_has_pbits != '\0') {
    bVar2 = (byte)*pbits;
    bVar13 = bVar2;
    if (pParams->m_endpoints_share_pbit == '\0') {
      bVar13 = (byte)pbits[1];
    }
    quantMinColor.m_c[1] = (byte)((uint)auVar3 >> 7) & 0xfe | bVar2;
    quantMinColor.m_c[0] = auVar3[0] * '\x02' | bVar2;
    quantMinColor.m_c[2] = (byte)((uint)auVar3 >> 0xf) & 0xfe | bVar2;
    quantMinColor.m_c[3] = (byte)((uint)auVar3 >> 0x17) & 0xfe | bVar2;
    quantMaxColor.m_c[1] = (byte)((uint)auVar4 >> 7) & 0xfe | bVar13;
    quantMaxColor.m_c[0] = auVar4[0] * '\x02' | bVar13;
    quantMaxColor.m_c[2] = (byte)((uint)auVar4 >> 0xf) & 0xfe | bVar13;
    quantMaxColor.m_c[3] = (byte)((uint)auVar4 >> 0x17) & 0xfe | bVar13;
  }
  cVar6 = scale_color(&quantMinColor,pParams);
  actualMinColor.m_c = cVar6.m_c;
  actualMaxColor = scale_color(&quantMaxColor,pParams);
  uVar18 = (ulong)pParams->m_num_selector_weights;
  pcVar30 = weightedColors;
  weightedColors[0].m_c = cVar6.m_c;
  uVar28 = pParams->m_num_selector_weights - 1;
  *&weightedColors[uVar28].m_c = actualMaxColor.m_c;
  bVar1 = pParams->m_has_alpha;
  for (uVar24 = 1; pcVar30 = pcVar30 + 1, uVar24 < uVar28; uVar24 = uVar24 + 1) {
    uVar5 = pParams->m_pSelector_weights[uVar24];
    for (lVar27 = 0; 4 - (ulong)(bVar1 == '\0') != lVar27; lVar27 = lVar27 + 1) {
      pcVar30->m_c[lVar27] =
           (uint8_t)((uint)actualMinColor.m_c[lVar27] * (0x40 - uVar5) +
                     actualMaxColor.m_c[lVar27] * uVar5 + 0x20 >> 6);
    }
  }
  if (pParams->m_perceptual == '\0') {
    uVar21 = (uint)cVar6.m_c & 0xff;
    uVar23 = (uint)cVar6.m_c >> 0x10 & 0xff;
    iVar7 = ((uint)actualMaxColor.m_c & 0xff) - uVar21;
    local_e0 = (uint)cVar6.m_c >> 8 & 0xff;
    iVar25 = ((uint)actualMaxColor.m_c >> 8 & 0xff) - ((uint)cVar6.m_c >> 8 & 0xff);
    iVar26 = ((uint)actualMaxColor.m_c >> 0x10 & 0xff) - uVar23;
    if (bVar1 == '\0') {
      lVar27 = 0;
      uVar24 = 0;
      for (uVar15 = 0; uVar9 = (uint64_t)pParams->m_num_pixels, uVar15 < uVar9; uVar15 = uVar15 + 1)
      {
        pcVar30 = pParams->m_pPixels;
        uVar8 = (uint)((float)(int)((pcVar30->m_c[lVar27 + 2] - uVar23) * iVar26 +
                                   (pcVar30->m_c[lVar27 + 1] - local_e0) * iVar25 +
                                   (pcVar30->m_c[lVar27] - uVar21) * iVar7) *
                       ((float)uVar18 /
                       ((float)(iVar26 * iVar26 + iVar25 * iVar25 + iVar7 * iVar7) + 1.25e-06)) +
                      0.5);
        uVar14 = uVar8;
        if ((int)uVar28 <= (int)uVar8) {
          uVar14 = uVar28;
        }
        uVar17 = 1;
        if (0 < (int)uVar8) {
          uVar17 = uVar14;
        }
        uVar10 = compute_color_distance_rgb
                           (weightedColors + (long)(int)uVar17 + -1,
                            (color_quad_u8 *)(pcVar30->m_c + lVar27),'\0',pParams->m_weights);
        uVar11 = compute_color_distance_rgb
                           (weightedColors + (int)uVar17,(color_quad_u8 *)(pcVar30->m_c + lVar27),
                            '\0',pParams->m_weights);
        uVar9 = uVar11;
        if (uVar10 < uVar11) {
          uVar9 = uVar10;
        }
        uVar14 = uVar17 - 1 & 0xff;
        if (uVar10 >= uVar11) {
          uVar14 = uVar17;
        }
        uVar24 = uVar24 + uVar9;
        pResults->m_pSelectors_temp[uVar15] = (uint8_t)uVar14;
        lVar27 = lVar27 + 4;
      }
    }
    else {
      iVar16 = ((uint)actualMaxColor.m_c >> 0x18) - ((uint)cVar6.m_c >> 0x18);
      lVar27 = 0;
      uVar24 = 0;
      for (uVar15 = 0; uVar9 = (uint64_t)pParams->m_num_pixels, uVar15 < uVar9; uVar15 = uVar15 + 1)
      {
        pcVar30 = pParams->m_pPixels;
        uVar8 = (uint)((float)(int)(((uint)pcVar30->m_c[lVar27 + 3] - ((uint)cVar6.m_c >> 0x18)) *
                                    iVar16 + (pcVar30->m_c[lVar27 + 2] - uVar23) * iVar26 +
                                   (pcVar30->m_c[lVar27 + 1] - local_e0) * iVar25 +
                                   (pcVar30->m_c[lVar27] - uVar21) * iVar7) *
                       ((float)uVar18 /
                       ((float)(iVar16 * iVar16 + iVar26 * iVar26 + iVar25 * iVar25 + iVar7 * iVar7)
                       + 1.25e-06)) + 0.5);
        uVar14 = uVar8;
        if ((int)uVar28 <= (int)uVar8) {
          uVar14 = uVar28;
        }
        uVar17 = 1;
        if (0 < (int)uVar8) {
          uVar17 = uVar14;
        }
        uVar10 = compute_color_distance_rgba
                           (weightedColors + (long)(int)uVar17 + -1,
                            (color_quad_u8 *)(pcVar30->m_c + lVar27),'\0',pParams->m_weights);
        uVar11 = compute_color_distance_rgba
                           (weightedColors + (int)uVar17,(color_quad_u8 *)(pcVar30->m_c + lVar27),
                            '\0',pParams->m_weights);
        uVar9 = uVar10;
        if (uVar11 < uVar10) {
          uVar9 = uVar11;
        }
        uVar14 = uVar17 - 1 & 0xff;
        if (uVar11 <= uVar10) {
          uVar14 = uVar17;
        }
        uVar24 = uVar24 + uVar9;
        pResults->m_pSelectors_temp[uVar15] = (uint8_t)uVar14;
        lVar27 = lVar27 + 4;
      }
    }
  }
  else {
    uVar24 = 0;
    for (uVar15 = 0; uVar9 = (uint64_t)pParams->m_num_pixels, uVar15 < uVar9; uVar15 = uVar15 + 1) {
      if (pParams->m_has_alpha == '\0') {
        pcVar30 = weightedColors;
        uVar22 = 0xffffffffffffffff;
        uVar20 = 0;
        for (uVar29 = 0; uVar19 = (uint8_t)uVar20, uVar18 != uVar29; uVar29 = uVar29 + 1) {
          uVar9 = compute_color_distance_rgb
                            (pcVar30,pParams->m_pPixels + uVar15,'\x01',pParams->m_weights);
          bVar31 = uVar9 < uVar22;
          if (bVar31) {
            uVar22 = uVar9;
          }
          if (bVar31) {
            uVar20 = (int)uVar29;
          }
          pcVar30 = pcVar30 + 1;
        }
      }
      else {
        pcVar30 = weightedColors;
        uVar22 = 0xffffffffffffffff;
        uVar20 = 0;
        for (uVar29 = 0; uVar19 = (uint8_t)uVar20, uVar18 != uVar29; uVar29 = uVar29 + 1) {
          uVar9 = compute_color_distance_rgba
                            (pcVar30,pParams->m_pPixels + uVar15,'\x01',pParams->m_weights);
          bVar31 = uVar9 < uVar22;
          if (bVar31) {
            uVar22 = uVar9;
          }
          if (bVar31) {
            uVar20 = (int)uVar29;
          }
          pcVar30 = pcVar30 + 1;
        }
      }
      uVar24 = uVar24 + uVar22;
      pResults->m_pSelectors_temp[uVar15] = uVar19;
    }
  }
  if (pResults->m_best_overall_err <= uVar24) {
    return uVar9;
  }
  pResults->m_best_overall_err = uVar24;
  *(undefined4 *)(pResults->m_low_endpoint).m_c = *(undefined4 *)pLow->m_c;
  *(undefined4 *)(pResults->m_high_endpoint).m_c = *(undefined4 *)pHigh->m_c;
  pResults->m_pbits[0] = *pbits;
  pResults->m_pbits[1] = pbits[1];
  pvVar12 = memcpy(pResults->m_pSelectors,pResults->m_pSelectors_temp,(ulong)pParams->m_num_pixels);
  return (uint64_t)pvVar12;
}

Assistant:

static uint64_t evaluate_solution(const color_quad_u8 *pLow, const color_quad_u8 *pHigh, const uint32_t pbits[2], const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults)
{
	color_quad_u8 quantMinColor = *pLow;
	color_quad_u8 quantMaxColor = *pHigh;

	if (pParams->m_has_pbits)
	{
		uint32_t minPBit, maxPBit;

		if (pParams->m_endpoints_share_pbit)
			maxPBit = minPBit = pbits[0];
		else
		{
			minPBit = pbits[0];
			maxPBit = pbits[1];
		}

		quantMinColor.m_c[0] = (uint8_t)((pLow->m_c[0] << 1) | minPBit);
		quantMinColor.m_c[1] = (uint8_t)((pLow->m_c[1] << 1) | minPBit);
		quantMinColor.m_c[2] = (uint8_t)((pLow->m_c[2] << 1) | minPBit);
		quantMinColor.m_c[3] = (uint8_t)((pLow->m_c[3] << 1) | minPBit);

		quantMaxColor.m_c[0] = (uint8_t)((pHigh->m_c[0] << 1) | maxPBit);
		quantMaxColor.m_c[1] = (uint8_t)((pHigh->m_c[1] << 1) | maxPBit);
		quantMaxColor.m_c[2] = (uint8_t)((pHigh->m_c[2] << 1) | maxPBit);
		quantMaxColor.m_c[3] = (uint8_t)((pHigh->m_c[3] << 1) | maxPBit);
	}

	color_quad_u8 actualMinColor = scale_color(&quantMinColor, pParams);
	color_quad_u8 actualMaxColor = scale_color(&quantMaxColor, pParams);

	const uint32_t N = pParams->m_num_selector_weights;

	color_quad_u8 weightedColors[16];
	weightedColors[0] = actualMinColor;
	weightedColors[N - 1] = actualMaxColor;

	const uint32_t nc = pParams->m_has_alpha ? 4 : 3;
	for (uint32_t i = 1; i < (N - 1); i++)
		for (uint32_t j = 0; j < nc; j++)
			weightedColors[i].m_c[j] = (uint8_t)((actualMinColor.m_c[j] * (64 - pParams->m_pSelector_weights[i]) + actualMaxColor.m_c[j] * pParams->m_pSelector_weights[i] + 32) >> 6);

	const int lr = actualMinColor.m_c[0];
	const int lg = actualMinColor.m_c[1];
	const int lb = actualMinColor.m_c[2];
	const int dr = actualMaxColor.m_c[0] - lr;
	const int dg = actualMaxColor.m_c[1] - lg;
	const int db = actualMaxColor.m_c[2] - lb;
	
	uint64_t total_err = 0;
	
	if (!pParams->m_perceptual)
	{
		if (pParams->m_has_alpha)
		{
			const int la = actualMinColor.m_c[3];
			const int da = actualMaxColor.m_c[3] - la;

			const float f = N / (float)(squarei(dr) + squarei(dg) + squarei(db) + squarei(da) + .00000125f);

			for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
			{
				const color_quad_u8 *pC = &pParams->m_pPixels[i];
				int r = pC->m_c[0];
				int g = pC->m_c[1];
				int b = pC->m_c[2];
				int a = pC->m_c[3];

				int best_sel = (int)((float)((r - lr) * dr + (g - lg) * dg + (b - lb) * db + (a - la) * da) * f + .5f);
				best_sel = clampi(best_sel, 1, N - 1);

				uint64_t err0 = compute_color_distance_rgba(&weightedColors[best_sel - 1], pC, BC7ENC_FALSE, pParams->m_weights);
				uint64_t err1 = compute_color_distance_rgba(&weightedColors[best_sel], pC, BC7ENC_FALSE, pParams->m_weights);

				if (err1 > err0)
				{
					err1 = err0;
					--best_sel;
				}
				total_err += err1;

				pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
			}
		}
		else
		{
			const float f = N / (float)(squarei(dr) + squarei(dg) + squarei(db) + .00000125f);

			for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
			{
				const color_quad_u8 *pC = &pParams->m_pPixels[i];
				int r = pC->m_c[0];
				int g = pC->m_c[1];
				int b = pC->m_c[2];

				int sel = (int)((float)((r - lr) * dr + (g - lg) * dg + (b - lb) * db) * f + .5f);
				sel = clampi(sel, 1, N - 1);

				uint64_t err0 = compute_color_distance_rgb(&weightedColors[sel - 1], pC, BC7ENC_FALSE, pParams->m_weights);
				uint64_t err1 = compute_color_distance_rgb(&weightedColors[sel], pC, BC7ENC_FALSE, pParams->m_weights);

				int best_sel = sel;
				uint64_t best_err = err1;
				if (err0 < best_err)
				{
					best_err = err0;
					best_sel = sel - 1;
				}

				total_err += best_err;

				pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
			}
		}
	}
	else
	{
		// TODO: This could be improved.
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint64_t best_err = UINT64_MAX;
			uint32_t best_sel = 0;

			if (pParams->m_has_alpha)
			{
				for (uint32_t j = 0; j < N; j++)
				{
					uint64_t err = compute_color_distance_rgba(&weightedColors[j], &pParams->m_pPixels[i], BC7ENC_TRUE, pParams->m_weights);
					if (err < best_err)
					{
						best_err = err;
						best_sel = j;
					}
				}
			}
			else
			{
				for (uint32_t j = 0; j < N; j++)
				{
					uint64_t err = compute_color_distance_rgb(&weightedColors[j], &pParams->m_pPixels[i], BC7ENC_TRUE, pParams->m_weights);
					if (err < best_err)
					{
						best_err = err;
						best_sel = j;
					}
				}
			}

			total_err += best_err;

			pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
		}
	}

	if (total_err < pResults->m_best_overall_err)
	{
		pResults->m_best_overall_err = total_err;

		pResults->m_low_endpoint = *pLow;
		pResults->m_high_endpoint = *pHigh;

		pResults->m_pbits[0] = pbits[0];
		pResults->m_pbits[1] = pbits[1];

		memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
	}
				
	return total_err;
}